

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

void __thiscall
sf::Texture::update(Texture *this,Uint8 *pixels,uint width,uint height,uint x,uint y)

{
  Uint64 UVar1;
  TransientContextLock lock;
  TextureSaver save;
  
  if ((pixels != (Uint8 *)0x0) && (this->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&lock);
    priv::TextureSaver::TextureSaver(&save);
    (*sf_glad_glBindTexture)(0xde1,this->m_texture);
    (*sf_glad_glTexSubImage2D)(0xde1,0,x,y,width,height,0x1908,0x1401,pixels);
    (*sf_glad_glTexParameteri)(0xde1,0x2801,this->m_isSmooth | 0x2600);
    this->m_hasMipmap = false;
    this->m_pixelsFlipped = false;
    UVar1 = anon_unknown.dwarf_442873::TextureImpl::getUniqueId();
    this->m_cacheId = UVar1;
    (*sf_glad_glFlush)();
    priv::TextureSaver::~TextureSaver(&save);
    GlResource::TransientContextLock::~TransientContextLock(&lock);
  }
  return;
}

Assistant:

void Texture::update(const Uint8* pixels, unsigned int width, unsigned int height, unsigned int x, unsigned int y)
{
    assert(x + width <= m_size.x);
    assert(y + height <= m_size.y);

    if (pixels && m_texture)
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the given array to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, static_cast<GLint>(x), static_cast<GLint>(y), static_cast<GLsizei>(width), static_cast<GLsizei>(height), GL_RGBA, GL_UNSIGNED_BYTE, pixels));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = TextureImpl::getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}